

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z3_32x8_sse4_1
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  undefined1 uVar1;
  char cVar2;
  longlong lVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined6 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  longlong *plVar22;
  long lVar23;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ushort uVar24;
  ushort uVar25;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  ulong uVar26;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  short sVar38;
  ushort uVar39;
  short sVar40;
  ushort uVar41;
  ulong uVar37;
  undefined1 auVar27 [16];
  short sVar33;
  short sVar42;
  undefined1 auVar28 [16];
  ushort uVar43;
  undefined1 auVar44 [16];
  int i_1;
  __m128i d [16];
  __m128i dstvec [32];
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i shift;
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i a_mbase_x;
  __m128i c3f;
  __m128i diff;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  __m128i *x2;
  __m128i *x1;
  __m128i *x0;
  int local_83c;
  longlong local_838 [32];
  undefined8 local_738 [12];
  longlong alStack_6d8 [2];
  longlong alStack_6c8 [2];
  longlong alStack_6b8 [50];
  long local_528;
  long local_520;
  int local_514;
  int local_510;
  int local_50c;
  undefined8 local_508;
  ulong uStack_500;
  undefined1 local_4f8 [16];
  ushort local_4e8;
  ushort uStack_4e6;
  ushort uStack_4e4;
  ushort uStack_4e2;
  ushort uStack_4e0;
  ushort uStack_4de;
  ushort uStack_4dc;
  ushort uStack_4da;
  ushort local_4d8;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4d0;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  char local_4c8;
  char cStack_4c7;
  char cStack_4c6;
  byte bStack_4c5;
  char cStack_4c4;
  byte bStack_4c3;
  char cStack_4c2;
  byte bStack_4c1;
  char in_stack_fffffffffffffb40;
  char in_stack_fffffffffffffb41;
  char in_stack_fffffffffffffb42;
  char cVar45;
  char in_stack_fffffffffffffb43;
  byte bVar46;
  char in_stack_fffffffffffffb44;
  char cVar47;
  char in_stack_fffffffffffffb45;
  byte bVar48;
  char in_stack_fffffffffffffb46;
  char cVar49;
  char in_stack_fffffffffffffb47;
  byte bVar50;
  short in_stack_fffffffffffffb48;
  short in_stack_fffffffffffffb4a;
  short in_stack_fffffffffffffb4c;
  short in_stack_fffffffffffffb4e;
  short in_stack_fffffffffffffb50;
  short in_stack_fffffffffffffb52;
  short in_stack_fffffffffffffb54;
  short in_stack_fffffffffffffb56;
  __m128i *in_stack_fffffffffffffb58;
  int iVar51;
  undefined2 uVar52;
  __m128i *x11;
  __m128i *x12;
  __m128i *x13;
  __m128i *x14;
  short in_stack_fffffffffffffb88;
  short in_stack_fffffffffffffb8a;
  short in_stack_fffffffffffffb8c;
  short in_stack_fffffffffffffb8e;
  short in_stack_fffffffffffffb90;
  short in_stack_fffffffffffffb92;
  short in_stack_fffffffffffffb94;
  short in_stack_fffffffffffffb96;
  __m128i *d1;
  __m128i *d2;
  undefined1 in_stack_fffffffffffffba8 [16];
  undefined1 in_stack_fffffffffffffbb8 [16];
  undefined1 in_stack_fffffffffffffbc8 [16];
  ushort local_3a8;
  ushort uStack_3a6;
  ushort uStack_3a4;
  ushort uStack_3a2;
  ushort uStack_3a0;
  ushort uStack_39e;
  ushort uStack_39c;
  ushort uStack_39a;
  ushort uStack_366;
  ushort uStack_364;
  ushort uStack_362;
  ushort uStack_35e;
  ushort uStack_35c;
  ushort uStack_35a;
  ushort local_348;
  ushort uStack_346;
  ushort uStack_344;
  ushort uStack_342;
  ushort uStack_340;
  ushort uStack_33e;
  ushort uStack_33c;
  ushort uStack_33a;
  ulong local_328;
  ulong uStack_320;
  undefined8 local_288;
  undefined8 local_268;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short sStack_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  undefined1 local_78 [8];
  undefined1 local_70 [64];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  
  bVar16 = (byte)in_ECX;
  iVar18 = 0x27 << (bVar16 & 0x1f);
  d1 = (__m128i *)0x10001000100010;
  d2 = (__m128i *)0x10001000100010;
  uVar1 = *(undefined1 *)(in_RDX + iVar18);
  local_70._0_3_ = CONCAT21(CONCAT11(uVar1,uVar1),uVar1);
  local_78._0_3_ = CONCAT21(CONCAT11(uVar1,uVar1),uVar1);
  x11 = (__m128i *)
        CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,local_78._0_3_)))
                               ));
  x12 = (__m128i *)
        CONCAT17(uVar1,CONCAT16(uVar1,CONCAT15(uVar1,CONCAT14(uVar1,CONCAT13(uVar1,local_70._0_3_)))
                               ));
  x13 = (__m128i *)0x3f003f003f003f;
  x14 = (__m128i *)0x3f003f003f003f;
  iVar51 = 0;
  iVar21 = in_R8D;
  while( true ) {
    uVar52 = (undefined2)iVar21;
    if (0x1f < iVar51) break;
    iVar19 = iVar21 >> (6 - bVar16 & 0x1f);
    iVar20 = iVar18 - iVar19 >> (bVar16 & 0x1f);
    iVar17 = iVar51;
    local_510 = iVar20;
    local_50c = iVar19;
    if (iVar20 < 1) goto LAB_00539b12;
    if (8 < iVar20) {
      local_510 = 8;
    }
    local_4f8 = *(undefined1 (*) [16])(in_RDX + iVar19);
    local_508 = *(undefined8 *)(in_RDX + iVar19 + 1);
    uStack_500 = *(ulong *)(in_RDX + iVar19 + 9);
    if (in_ECX == 0) {
      uVar26 = CONCAT26(uVar52,CONCAT24(uVar52,CONCAT22(uVar52,uVar52))) & 0x3f003f003f003f;
      uVar37 = CONCAT26(uVar52,CONCAT24(uVar52,CONCAT22(uVar52,uVar52))) & 0x3f003f003f003f;
      local_348 = (ushort)uVar26;
      uStack_346 = (ushort)(uVar26 >> 0x10);
      uStack_344 = (ushort)(uVar26 >> 0x20);
      uStack_342 = (ushort)(uVar26 >> 0x30);
      uStack_340 = (ushort)uVar37;
      uStack_33e = (ushort)(uVar37 >> 0x10);
      uStack_33c = (ushort)(uVar37 >> 0x20);
      uStack_33a = (ushort)(uVar37 >> 0x30);
      local_3a8 = local_348;
      uStack_3a6 = uStack_346;
      uStack_3a4 = uStack_344;
      uStack_3a2 = uStack_342;
      uStack_3a0 = uStack_340;
      uStack_39e = uStack_33e;
      uStack_39c = uStack_33c;
      uStack_39a = uStack_33a;
    }
    else {
      auVar44._8_8_ = EvenOddMaskx[0]._8_8_;
      auVar44._0_8_ = EvenOddMaskx[0]._0_8_;
      local_4f8 = pshufb(*(undefined1 (*) [16])(in_RDX + iVar19),auVar44);
      local_508 = local_4f8._8_8_;
      uStack_500 = 0;
      auVar27._2_2_ = uVar52;
      auVar27._0_2_ = uVar52;
      auVar27._4_2_ = uVar52;
      auVar27._6_2_ = uVar52;
      auVar27._10_2_ = uVar52;
      auVar27._8_2_ = uVar52;
      auVar27._12_2_ = uVar52;
      auVar27._14_2_ = uVar52;
      auVar44 = psllw(auVar27,ZEXT416(in_ECX));
      local_328 = auVar44._0_8_;
      uStack_320 = auVar44._8_8_;
      local_328 = local_328 & 0x3f003f003f003f;
      uStack_320 = uStack_320 & 0x3f003f003f003f;
      local_3a8 = (ushort)local_328;
      uStack_3a6 = (ushort)(local_328 >> 0x10);
      uStack_3a4 = (ushort)(local_328 >> 0x20);
      uStack_3a2 = (ushort)(local_328 >> 0x30);
      uStack_3a0 = (ushort)uStack_320;
      uStack_39e = (ushort)(uStack_320 >> 0x10);
      uStack_39c = (ushort)(uStack_320 >> 0x20);
      uStack_39a = (ushort)(uStack_320 >> 0x30);
    }
    uStack_4da = uStack_39a >> 1;
    uStack_4dc = uStack_39c >> 1;
    uStack_4de = uStack_39e >> 1;
    uStack_4e0 = uStack_3a0 >> 1;
    uStack_4e2 = uStack_3a2 >> 1;
    uStack_4e4 = uStack_3a4 >> 1;
    uStack_4e6 = uStack_3a6 >> 1;
    local_4e8 = local_3a8 >> 1;
    local_268 = local_4f8._0_8_;
    auVar44 = pmovzxbw(local_4f8,local_268);
    auVar9._8_8_ = uStack_500;
    auVar9._0_8_ = local_508;
    auVar27 = pmovzxbw(auVar9,local_508);
    local_228 = auVar27._0_2_;
    sStack_226 = auVar27._2_2_;
    sStack_224 = auVar27._4_2_;
    sStack_222 = auVar27._6_2_;
    sStack_220 = auVar27._8_2_;
    sStack_21e = auVar27._10_2_;
    sStack_21c = auVar27._12_2_;
    sStack_21a = auVar27._14_2_;
    local_238 = auVar44._0_2_;
    sStack_236 = auVar44._2_2_;
    sStack_234 = auVar44._4_2_;
    sStack_232 = auVar44._6_2_;
    sStack_230 = auVar44._8_2_;
    sStack_22e = auVar44._10_2_;
    sStack_22c = auVar44._12_2_;
    sStack_22a = auVar44._14_2_;
    auVar44 = psllw(auVar44,ZEXT416(5));
    local_1a8 = auVar44._0_2_;
    sStack_1a6 = auVar44._2_2_;
    sStack_1a4 = auVar44._4_2_;
    sStack_1a2 = auVar44._6_2_;
    sStack_1a0 = auVar44._8_2_;
    sStack_19e = auVar44._10_2_;
    sStack_19c = auVar44._12_2_;
    sStack_19a = auVar44._14_2_;
    uVar24 = local_1a8 + 0x10 + (local_228 - local_238) * local_4e8;
    sVar29 = sStack_1a6 + 0x10 + (sStack_226 - sStack_236) * uStack_4e6;
    sVar31 = sStack_1a4 + 0x10 + (sStack_224 - sStack_234) * uStack_4e4;
    sVar33 = sStack_1a2 + 0x10 + (sStack_222 - sStack_232) * uStack_4e2;
    uVar35 = sStack_1a0 + 0x10 + (sStack_220 - sStack_230) * uStack_4e0;
    sVar38 = sStack_19e + 0x10 + (sStack_21e - sStack_22e) * uStack_4de;
    sVar40 = sStack_19c + 0x10 + (sStack_21c - sStack_22c) * uStack_4dc;
    sVar42 = sStack_19a + 0x10 + (sStack_21a - sStack_22a) * uStack_4da;
    cStack_4c6 = (char)sVar29;
    bStack_4c5 = (byte)((ushort)sVar29 >> 8);
    cStack_4c4 = (char)sVar31;
    bStack_4c3 = (byte)((ushort)sVar31 >> 8);
    cStack_4c2 = (char)sVar33;
    bStack_4c1 = (byte)((ushort)sVar33 >> 8);
    bVar46 = (byte)((ushort)sVar38 >> 8);
    bVar48 = (byte)((ushort)sVar40 >> 8);
    bVar50 = (byte)((ushort)sVar42 >> 8);
    uVar10 = CONCAT13(bStack_4c5,CONCAT12(cStack_4c6,uVar24));
    uVar11 = CONCAT15(bStack_4c3,CONCAT14(cStack_4c4,uVar10));
    uVar12 = CONCAT13(bVar46,CONCAT12((char)sVar38,uVar35));
    uVar13 = CONCAT15(bVar48,CONCAT14((char)sVar40,uVar12));
    uVar24 = uVar24 >> 5;
    uVar35 = uVar35 >> 5;
    cStack_4c6 = (char)(ushort)((uint)uVar10 >> 0x15);
    bStack_4c5 = bStack_4c5 >> 5;
    cStack_4c4 = (char)(ushort)((uint6)uVar11 >> 0x25);
    bStack_4c3 = bStack_4c3 >> 5;
    cStack_4c2 = (char)(ushort)(CONCAT17(bStack_4c1,CONCAT16(cStack_4c2,uVar11)) >> 0x35);
    bStack_4c1 = bStack_4c1 >> 5;
    cVar45 = (char)(ushort)((uint)uVar12 >> 0x15);
    cVar47 = (char)(ushort)((uint6)uVar13 >> 0x25);
    cVar49 = (char)(ushort)(CONCAT17(bVar50,CONCAT16((char)sVar42,uVar13)) >> 0x35);
    local_288 = local_4f8._8_8_;
    in_stack_fffffffffffffbc8 = pmovzxbw(local_4f8 >> 0x40,local_288);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uStack_500;
    in_stack_fffffffffffffbb8 = pmovzxbw(auVar28,uStack_500);
    local_248 = in_stack_fffffffffffffbb8._0_2_;
    sStack_246 = in_stack_fffffffffffffbb8._2_2_;
    sStack_244 = in_stack_fffffffffffffbb8._4_2_;
    sStack_242 = in_stack_fffffffffffffbb8._6_2_;
    sStack_240 = in_stack_fffffffffffffbb8._8_2_;
    sStack_23e = in_stack_fffffffffffffbb8._10_2_;
    sStack_23c = in_stack_fffffffffffffbb8._12_2_;
    sStack_23a = in_stack_fffffffffffffbb8._14_2_;
    local_258 = in_stack_fffffffffffffbc8._0_2_;
    sStack_256 = in_stack_fffffffffffffbc8._2_2_;
    sStack_254 = in_stack_fffffffffffffbc8._4_2_;
    sStack_252 = in_stack_fffffffffffffbc8._6_2_;
    sStack_250 = in_stack_fffffffffffffbc8._8_2_;
    sStack_24e = in_stack_fffffffffffffbc8._10_2_;
    sStack_24c = in_stack_fffffffffffffbc8._12_2_;
    sStack_24a = in_stack_fffffffffffffbc8._14_2_;
    in_stack_fffffffffffffb88 = local_248 - local_258;
    in_stack_fffffffffffffb8a = sStack_246 - sStack_256;
    in_stack_fffffffffffffb8c = sStack_244 - sStack_254;
    in_stack_fffffffffffffb8e = sStack_242 - sStack_252;
    in_stack_fffffffffffffb90 = sStack_240 - sStack_250;
    in_stack_fffffffffffffb92 = sStack_23e - sStack_24e;
    in_stack_fffffffffffffb94 = sStack_23c - sStack_24c;
    in_stack_fffffffffffffb96 = sStack_23a - sStack_24a;
    auVar44 = psllw(in_stack_fffffffffffffbc8,ZEXT416(5));
    local_1e8 = auVar44._0_2_;
    sStack_1e6 = auVar44._2_2_;
    sStack_1e4 = auVar44._4_2_;
    sStack_1e2 = auVar44._6_2_;
    sStack_1e0 = auVar44._8_2_;
    sStack_1de = auVar44._10_2_;
    sStack_1dc = auVar44._12_2_;
    sStack_1da = auVar44._14_2_;
    in_stack_fffffffffffffba8._2_2_ = sStack_1e6 + 0x10;
    in_stack_fffffffffffffba8._0_2_ = local_1e8 + 0x10;
    in_stack_fffffffffffffba8._4_2_ = sStack_1e4 + 0x10;
    in_stack_fffffffffffffba8._6_2_ = sStack_1e2 + 0x10;
    in_stack_fffffffffffffba8._8_2_ = sStack_1e0 + 0x10;
    in_stack_fffffffffffffba8._10_2_ = sStack_1de + 0x10;
    in_stack_fffffffffffffba8._12_2_ = sStack_1dc + 0x10;
    in_stack_fffffffffffffba8._14_2_ = sStack_1da + 0x10;
    in_stack_fffffffffffffb48 = in_stack_fffffffffffffb88 * local_4e8;
    in_stack_fffffffffffffb4a = in_stack_fffffffffffffb8a * uStack_4e6;
    in_stack_fffffffffffffb4c = in_stack_fffffffffffffb8c * uStack_4e4;
    in_stack_fffffffffffffb4e = in_stack_fffffffffffffb8e * uStack_4e2;
    in_stack_fffffffffffffb50 = in_stack_fffffffffffffb90 * uStack_4e0;
    in_stack_fffffffffffffb52 = in_stack_fffffffffffffb92 * uStack_4de;
    in_stack_fffffffffffffb54 = in_stack_fffffffffffffb94 * uStack_4dc;
    in_stack_fffffffffffffb56 = in_stack_fffffffffffffb96 * uStack_4da;
    uVar25 = (ushort)(local_1e8 + 0x10 + in_stack_fffffffffffffb48) >> 5;
    uVar30 = (ushort)(sStack_1e6 + 0x10 + in_stack_fffffffffffffb4a) >> 5;
    uVar32 = (ushort)(sStack_1e4 + 0x10 + in_stack_fffffffffffffb4c) >> 5;
    uVar34 = (ushort)(sStack_1e2 + 0x10 + in_stack_fffffffffffffb4e) >> 5;
    uVar36 = (ushort)(sStack_1e0 + 0x10 + in_stack_fffffffffffffb50) >> 5;
    uVar39 = (ushort)(sStack_1de + 0x10 + in_stack_fffffffffffffb52) >> 5;
    uVar41 = (ushort)(sStack_1dc + 0x10 + in_stack_fffffffffffffb54) >> 5;
    uVar43 = (ushort)(sStack_1da + 0x10 + in_stack_fffffffffffffb56) >> 5;
    uVar10 = CONCAT13(bStack_4c5,CONCAT12(cStack_4c6,uVar24));
    uVar11 = CONCAT15(bStack_4c3,CONCAT14(cStack_4c4,uVar10));
    uVar12 = CONCAT13(bVar46 >> 5,CONCAT12(cVar45,uVar35));
    uVar13 = CONCAT15(bVar48 >> 5,CONCAT14(cVar47,uVar12));
    uStack_146 = (ushort)((uint)uVar10 >> 0x10);
    uStack_144 = (ushort)((uint6)uVar11 >> 0x20);
    uStack_142 = (ushort)(CONCAT17(bStack_4c1,CONCAT16(cStack_4c2,uVar11)) >> 0x30);
    uStack_13e = (ushort)((uint)uVar12 >> 0x10);
    uStack_13c = (ushort)((uint6)uVar13 >> 0x20);
    uStack_13a = (ushort)(CONCAT17(bVar50 >> 5,CONCAT16(cVar49,uVar13)) >> 0x30);
    cVar2 = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    cVar3 = (uStack_146 != 0) * (uStack_146 < 0x100) * cStack_4c6 - (0xff < uStack_146);
    cVar4 = (uStack_144 != 0) * (uStack_144 < 0x100) * cStack_4c4 - (0xff < uStack_144);
    cVar5 = (uStack_142 != 0) * (uStack_142 < 0x100) * cStack_4c2 - (0xff < uStack_142);
    cVar6 = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    cVar7 = (uStack_13e != 0) * (uStack_13e < 0x100) * cVar45 - (0xff < uStack_13e);
    cVar47 = (uStack_13c != 0) * (uStack_13c < 0x100) * cVar47 - (0xff < uStack_13c);
    cVar45 = (uStack_13a != 0) * (uStack_13a < 0x100) * cVar49 - (0xff < uStack_13a);
    in_stack_fffffffffffffb40 = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    in_stack_fffffffffffffb41 = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    in_stack_fffffffffffffb42 = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    in_stack_fffffffffffffb43 = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    in_stack_fffffffffffffb44 = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    in_stack_fffffffffffffb45 = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    in_stack_fffffffffffffb46 = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    in_stack_fffffffffffffb47 = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
    auVar14[1] = cVar3;
    auVar14[0] = cVar2;
    auVar14[2] = cVar4;
    auVar14[3] = cVar5;
    auVar14[4] = cVar6;
    auVar14[5] = cVar7;
    auVar14[6] = cVar47;
    auVar14[7] = cVar45;
    auVar14[9] = in_stack_fffffffffffffb41;
    auVar14[8] = in_stack_fffffffffffffb40;
    auVar14[10] = in_stack_fffffffffffffb42;
    auVar14[0xb] = in_stack_fffffffffffffb43;
    auVar14[0xc] = in_stack_fffffffffffffb44;
    auVar14[0xd] = in_stack_fffffffffffffb45;
    auVar14[0xe] = in_stack_fffffffffffffb46;
    auVar14[0xf] = in_stack_fffffffffffffb47;
    auVar15._8_8_ = x12;
    auVar15._0_8_ = x11;
    auVar44 = pblendvb(auVar15,auVar14,(undefined1  [16])Mask[0][local_510]);
    *(undefined1 (*) [16])(local_738 + (long)iVar51 * 2) = auVar44;
    iVar21 = in_R8D + iVar21;
    iVar51 = iVar51 + 1;
    local_4d8 = uVar25;
    uStack_4d6 = uVar30;
    uStack_4d4 = uVar32;
    uStack_4d2 = uVar34;
    uStack_4d0 = uVar36;
    uStack_4ce = uVar39;
    uStack_4cc = uVar41;
    uStack_4ca = uVar43;
    local_4c8 = cVar2;
    cStack_4c7 = cVar3;
    cStack_4c6 = cVar4;
    bStack_4c5 = cVar5;
    cStack_4c4 = cVar6;
    bStack_4c3 = cVar7;
    cStack_4c2 = cVar47;
    bStack_4c1 = cVar45;
  }
LAB_0053a357:
  x2 = &alStack_6d8;
  x1 = &alStack_6c8;
  x0 = (__m128i *)alStack_6b8;
  local_528 = in_RSI;
  local_520 = in_RDI;
  transpose16x8_8x16_sse2
            (x0,x1,x2,(__m128i *)(local_838 + 0xe),(__m128i *)(local_838 + 0xc),
             (__m128i *)(local_838 + 10),
             (__m128i *)
             CONCAT17(in_stack_fffffffffffffb47,
                      CONCAT16(in_stack_fffffffffffffb46,
                               CONCAT15(in_stack_fffffffffffffb45,
                                        CONCAT14(in_stack_fffffffffffffb44,
                                                 CONCAT13(in_stack_fffffffffffffb43,
                                                          CONCAT12(in_stack_fffffffffffffb42,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb41,
                                                  in_stack_fffffffffffffb40))))))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb4e,
                      CONCAT24(in_stack_fffffffffffffb4c,
                               CONCAT22(in_stack_fffffffffffffb4a,in_stack_fffffffffffffb48))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb56,
                      CONCAT24(in_stack_fffffffffffffb54,
                               CONCAT22(in_stack_fffffffffffffb52,in_stack_fffffffffffffb50))),
             in_stack_fffffffffffffb58,
             (__m128i *)CONCAT26((short)((uint)iVar21 >> 0x10),CONCAT24(uVar52,iVar51)),x11,x12,
             (__m128i *)0x3f003f003f003f,(__m128i *)0x3f003f003f003f,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb8e,
                      CONCAT24(in_stack_fffffffffffffb8c,
                               CONCAT22(in_stack_fffffffffffffb8a,in_stack_fffffffffffffb88))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb96,
                      CONCAT24(in_stack_fffffffffffffb94,
                               CONCAT22(in_stack_fffffffffffffb92,in_stack_fffffffffffffb90))),
             (__m128i *)0x10001000100010,(__m128i *)0x10001000100010,in_stack_fffffffffffffba8._0_8_
             ,in_stack_fffffffffffffba8._8_8_,in_stack_fffffffffffffbb8._0_8_,
             in_stack_fffffffffffffbb8._8_8_,in_stack_fffffffffffffbc8._0_8_);
  transpose16x8_8x16_sse2
            (x0,x1,x2,(__m128i *)(local_838 + 0x1e),(__m128i *)(local_838 + 0x1c),
             (__m128i *)(local_838 + 0x1a),
             (__m128i *)
             CONCAT17(in_stack_fffffffffffffb47,
                      CONCAT16(in_stack_fffffffffffffb46,
                               CONCAT15(in_stack_fffffffffffffb45,
                                        CONCAT14(in_stack_fffffffffffffb44,
                                                 CONCAT13(in_stack_fffffffffffffb43,
                                                          CONCAT12(in_stack_fffffffffffffb42,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb41,
                                                  in_stack_fffffffffffffb40))))))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb4e,
                      CONCAT24(in_stack_fffffffffffffb4c,
                               CONCAT22(in_stack_fffffffffffffb4a,in_stack_fffffffffffffb48))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb56,
                      CONCAT24(in_stack_fffffffffffffb54,
                               CONCAT22(in_stack_fffffffffffffb52,in_stack_fffffffffffffb50))),
             in_stack_fffffffffffffb58,
             (__m128i *)CONCAT26((short)((uint)iVar21 >> 0x10),CONCAT24((short)iVar21,iVar51)),x11,
             x12,x13,x14,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb8e,
                      CONCAT24(in_stack_fffffffffffffb8c,
                               CONCAT22(in_stack_fffffffffffffb8a,in_stack_fffffffffffffb88))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffffb96,
                      CONCAT24(in_stack_fffffffffffffb94,
                               CONCAT22(in_stack_fffffffffffffb92,in_stack_fffffffffffffb90))),d1,d2
             ,in_stack_fffffffffffffba8._0_8_,in_stack_fffffffffffffba8._8_8_,
             in_stack_fffffffffffffbb8._0_8_,in_stack_fffffffffffffbb8._8_8_,
             in_stack_fffffffffffffbc8._0_8_);
  for (local_83c = 0; local_83c < 8; local_83c = local_83c + 1) {
    plVar22 = (longlong *)(local_520 + local_83c * local_528);
    lVar8 = local_838[(long)local_83c * 2 + 1];
    *plVar22 = local_838[(long)local_83c * 2];
    plVar22[1] = lVar8;
    lVar23 = local_520 + local_83c * local_528;
    lVar8 = local_838[(long)(local_83c + 8) * 2 + 1];
    *(longlong *)(lVar23 + 0x10) = local_838[(long)(local_83c + 8) * 2];
    *(longlong *)(lVar23 + 0x18) = lVar8;
  }
  return;
LAB_00539b12:
  while (local_514 = iVar17, local_514 < 0x20) {
    local_738[(long)local_514 * 2] = x11;
    local_738[(long)local_514 * 2 + 1] = x12;
    iVar17 = local_514 + 1;
  }
  goto LAB_0053a357;
}

Assistant:

static void dr_prediction_z3_32x8_sse4_1(uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *left, int upsample_left,
                                         int dy) {
  __m128i dstvec[32], d[16];

  dr_prediction_z1_HxW_internal_sse4_1(8, 32, dstvec, left, upsample_left, dy);

  transpose16x8_8x16_sse2(
      &dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3], &dstvec[4], &dstvec[5],
      &dstvec[6], &dstvec[7], &dstvec[8], &dstvec[9], &dstvec[10], &dstvec[11],
      &dstvec[12], &dstvec[13], &dstvec[14], &dstvec[15], &d[0], &d[1], &d[2],
      &d[3], &d[4], &d[5], &d[6], &d[7]);
  transpose16x8_8x16_sse2(
      &dstvec[0 + 16], &dstvec[1 + 16], &dstvec[2 + 16], &dstvec[3 + 16],
      &dstvec[4 + 16], &dstvec[5 + 16], &dstvec[6 + 16], &dstvec[7 + 16],
      &dstvec[8 + 16], &dstvec[9 + 16], &dstvec[10 + 16], &dstvec[11 + 16],
      &dstvec[12 + 16], &dstvec[13 + 16], &dstvec[14 + 16], &dstvec[15 + 16],
      &d[0 + 8], &d[1 + 8], &d[2 + 8], &d[3 + 8], &d[4 + 8], &d[5 + 8],
      &d[6 + 8], &d[7 + 8]);

  for (int i = 0; i < 8; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride), d[i]);
    _mm_storeu_si128((__m128i *)(dst + i * stride + 16), d[i + 8]);
  }
}